

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DExporter.cpp
# Opt level: O2

void __thiscall
Assimp::X3DExporter::AttrHelper_Vec2DArrToString
          (X3DExporter *this,aiVector2D *pArray,size_t pArray_Size,string *pTargetString)

{
  size_t sVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pTargetString->_M_string_length = 0;
  *(pTargetString->_M_dataplus)._M_p = '\0';
  std::__cxx11::string::reserve((ulong)pTargetString);
  for (sVar1 = 0; pArray_Size != sVar1; sVar1 = sVar1 + 1) {
    std::__cxx11::to_string(&local_b0,pArray[sVar1].x);
    std::operator+(&local_d0,&local_b0," ");
    std::__cxx11::to_string(&local_90,pArray[sVar1].y);
    std::operator+(&local_70,&local_d0,&local_90);
    std::operator+(&local_50,&local_70," ");
    std::__cxx11::string::append((string *)pTargetString);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  std::__cxx11::string::resize((ulong)pTargetString);
  AttrHelper_CommaToPoint(this,pTargetString);
  return;
}

Assistant:

void X3DExporter::AttrHelper_Vec2DArrToString(const aiVector2D* pArray, const size_t pArray_Size, std::string& pTargetString)
{
	pTargetString.clear();
	pTargetString.reserve(pArray_Size * 4);// (Number + space) * 2.
	for(size_t idx = 0; idx < pArray_Size; idx++)
		pTargetString.append(to_string(pArray[idx].x) + " " + to_string(pArray[idx].y) + " ");

	// remove last space symbol.
	pTargetString.resize(pTargetString.length() - 1);
	AttrHelper_CommaToPoint(pTargetString);
}